

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O3

Result<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
makeArraySet<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (Result<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,Index pos)

{
  undefined8 *puVar1;
  Result<wasm::WATParser::Ok> *extraout_RAX;
  undefined1 local_88 [8];
  Result<wasm::HeapType> type;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40 [8];
  Result<wasm::HeapType> _val;
  
  typeidx<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
            ((Result<wasm::HeapType> *)local_88,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err>::
  _Copy_ctor_base((_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_40,
                  (_Copy_ctor_base<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_88);
  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u._24_1_ == '\x01') {
    type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
    super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ = &local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20),local_40
               ,(long)_val.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._M_u.
                      _M_first._M_storage.id + (long)local_40);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
                     super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10)
    ;
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
      super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> = puVar1;
    if ((undefined8 *)
        type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_ == &local_50) {
      *puVar1 = local_50;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x18) =
           uStack_48;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>
        .super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
        super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> =
           type.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::WATParser::Err>._32_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
               super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x10) =
           local_50;
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 8) = local_58
    ;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) =
         '\x01';
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_40);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_40);
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::Err>.
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::Err> + 0x20) = '\0';
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::HeapType,_wasm::WATParser::Err> *)local_88);
  return extraout_RAX;
}

Assistant:

Result<typename Ctx::InstrT> makeArraySet(Ctx& ctx, Index pos) {
  auto type = typeidx(ctx);
  CHECK_ERR(type);
  return ctx.makeArraySet(pos, *type);
}